

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_EvaluateNurbsBasisDerivatives(int order,double *knot,int der_count,double *N)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong sz_00;
  double dVar5;
  void **local_328;
  size_t sz;
  size_t dbl_count;
  void *heap_buffer;
  double stack_buffer [80];
  int Nstride;
  int d;
  int jmax;
  int k;
  int j;
  int i;
  double **dk;
  double *ptr;
  double *a1;
  double *a0;
  double *k1;
  double *k0;
  double c;
  double dN;
  double *N_local;
  double *pdStack_18;
  int der_count_local;
  double *knot_local;
  int order_local;
  
  iVar2 = order + -1;
  dbl_count = 0;
  lVar4 = (long)(order * ((order >> 1) + 2));
  sz_00 = lVar4 * 8 + (long)(der_count + 1) * 8;
  if (sz_00 < 0x281) {
    local_328 = &heap_buffer;
  }
  else {
    local_328 = (void **)onmalloc(sz_00);
    dbl_count = (size_t)local_328;
  }
  a1 = (double *)local_328;
  ptr = (double *)(local_328 + order);
  local_328 = local_328 + lVar4;
  *local_328 = (void **)ptr + order;
  pdStack_18 = knot;
  for (d = 0; d < der_count; d = d + 1) {
    iVar3 = iVar2 - d;
    k1 = pdStack_18;
    a0 = pdStack_18 + iVar3;
    for (k = 0; k < iVar3; k = k + 1) {
      *(double *)((long)local_328[d] + (long)k * 8) = 1.0 / (*a0 - *k1);
      a0 = a0 + 1;
      k1 = k1 + 1;
    }
    local_328[d + 1] = (void *)((long)local_328[d] + (long)iVar3 * 8);
    pdStack_18 = pdStack_18 + 1;
  }
  dN = (double)(N + order);
  for (k = 0; k < order; k = k + 1) {
    *a1 = 1.0;
    for (d = 1; d <= der_count; d = d + 1) {
      c = 0.0;
      jmax = d - k;
      if (jmax < 1) {
        dVar5 = *a1 * *(double *)((long)local_328[(long)d + -1] + (long)(k - d) * 8);
        *ptr = dVar5;
        c = dVar5 * *(double *)((long)dN + (long)k * 8);
        jmax = 1;
      }
      if (iVar2 - k < d) {
        for (; jmax <= iVar2 - k; jmax = jmax + 1) {
          dVar5 = (a1[jmax] - a1[jmax + -1]) *
                  *(double *)((long)local_328[(long)d + -1] + (long)((k + jmax) - d) * 8);
          ptr[jmax] = dVar5;
          c = dVar5 * *(double *)((long)dN + (long)(k + jmax) * 8) + c;
        }
      }
      else {
        for (; jmax < d; jmax = jmax + 1) {
          dVar5 = (a1[jmax] - a1[jmax + -1]) *
                  *(double *)((long)local_328[(long)d + -1] + (long)((k + jmax) - d) * 8);
          ptr[jmax] = dVar5;
          c = dVar5 * *(double *)((long)dN + (long)(k + jmax) * 8) + c;
        }
        dVar5 = -a1[d + -1] * *(double *)((long)local_328[(long)d + -1] + (long)k * 8);
        ptr[d] = dVar5;
        c = dVar5 * *(double *)((long)dN + (long)(k + d) * 8) + c;
      }
      *(double *)((long)dN + (long)k * 8) = c;
      dN = (double)((long)dN + (long)order * 8);
      pdVar1 = ptr;
      ptr = a1;
      a1 = pdVar1;
    }
    dN = (double)((long)dN + (long)(-der_count * order) * 8);
  }
  k0 = (double *)(double)iVar2;
  d = der_count;
  c = (double)k0;
  while (k = order, d != 0) {
    while (k != 0) {
      *(double *)dN = (double)k0 * *(double *)dN;
      k = k + -1;
      dN = (double)((long)dN + 8);
    }
    c = c - 1.0;
    k0 = (double *)(c * (double)k0);
    d = d + -1;
  }
  if (dbl_count != 0) {
    onfree((void *)dbl_count);
  }
  return true;
}

Assistant:

bool ON_EvaluateNurbsBasisDerivatives(
  int order,
  const double* knot, 
  int der_count,
  double* N 
)
{
	double dN, c;
	const double *k0, *k1;
	double *a0, *a1, *ptr, **dk;
	int i, j, k, jmax;

	const int d = order-1;
	const int Nstride = -der_count*order;

	/* workspaces for knot differences and coefficients 
	 *
	 * a0[] and a1[] have order doubles
	 *
	 * dk[0] = array of d knot differences
	 * dk[1] = array of (d-1) knot differences
	 *
	 * dk[der_count-1] = 1.0/(knot[d] - knot[d-1])
	 * dk[der_count] = dummy pointer to make loop efficient
	 */

	//dk = (double**)alloca( (der_count+1) << 3 ); /* << 3 in case pointers are 8 bytes long */
	//a0 = (double*)alloca( (order*(2 + ((d+1)>>1))) << 3 ); /* d for a0, d for a1, d*order/2 for dk[]'s and slop to avoid /2 */
	//a1 = a0 + order;

  double stack_buffer[80];
  void* heap_buffer = 0;
  const size_t dbl_count = (order*(2 + ((d+1)>>1)));
  const size_t sz = ( dbl_count*sizeof(*a0) + (der_count+1)*sizeof(*dk) );

  a0 = (sz <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer = onmalloc(sz));
	a1 = a0 + order;
  dk = (double**)(a0 + dbl_count);

	/* initialize reciprocal of knot differences */
	dk[0] = a1 + order;
	for (k = 0; k < der_count; k++) {
		j = d-k;
		k0 = knot++;
		k1 = k0 + j;
		for (i = 0; i < j; i++) 
			dk[k][i] = 1.0/(*k1++ - *k0++);
		dk[k+1] = dk[k] + j;
	}
	dk--;
	/* dk[1] = 1/{t[d]-t[0], t[d+1]-t[1], ..., t[2d-2] - t[d-2], t[2d-1] - t[d-1]}
	 *       = diffs needed for 1rst derivative
	 * dk[2] = 1/{t[d]-t[1], t[d+1]-t[2], ..., t[2d-2] - t[d-1]}
	 *       = diffs needed for 2nd derivative
	 * ...
	 * dk[d] = 1/{t[d] - t[d-1]}
	 *       = diff needed for d-th derivative
	 *
	 * d[k][n] = 1.0/( t[d+n] - t[k-1+n] )
	 */
	
	N += order;
	/* set N[0] ,..., N[d] = 1rst derivatives, 
	 * N[order], ..., N[order+d] = 2nd, etc.
	 */
	for ( i=0; i<order; i++) {
		a0[0] = 1.0;
		for (k = 1; k <= der_count; k++) {
			/* compute k-th derivative of N_i^d up to d!/(d-k)! scaling factor */
			dN = 0.0;
			j = k-i; 
			if (j <= 0) {
				dN = (a1[0] = a0[0]*dk[k][i-k])*N[i];
				j = 1;
			}
			jmax = d-i; 
			if (jmax < k) {
				while (j <= jmax) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
			}
			else {
				/* sum j all the way to j = k */
				while (j < k) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
				dN += (a1[k] = -a0[k-1]*dk[k][i])*N[i+k];
			}

			/* d!/(d-k)!*dN = value of k-th derivative */
			N[i] = dN;
			N += order;
			/* a1[] s for next derivative = linear combination
			 * of a[]s used to compute this derivative.
			 */
			ptr = a0; a0 = a1; a1 = ptr;
		}
		N += Nstride;
	}

	/* apply d!/(d-k)! scaling factor */
	dN = c = (double)d;
	k = der_count;
	while (k--) {
		i = order;
		while (i--)
			*N++ *= c;
		dN -= 1.0;
		c *= dN;
	}

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return true;
}